

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# readline.c
# Opt level: O3

uchar rl_bind_wrapper(EditLine *el,uchar c)

{
  uchar uVar1;
  LineInfo *pLVar2;
  int iVar3;
  undefined7 in_register_00000031;
  ulong uVar4;
  
  uVar4 = CONCAT71(in_register_00000031,c) & 0xffffffff;
  if (map[uVar4] == (rl_command_func_t *)0x0) {
    uVar1 = '\x06';
  }
  else {
    pLVar2 = el_line(e);
    iVar3 = (int)pLVar2->buffer;
    rl_point = *(int *)&pLVar2->cursor - iVar3;
    rl_end = (int)pLVar2->lastchar - iVar3;
    rl_line_buffer[rl_end] = '\0';
    (*map[uVar4])(L'\x01',(wchar_t)c);
    uVar1 = (rl_done != L'\0') * '\x02';
  }
  return uVar1;
}

Assistant:

static unsigned char
rl_bind_wrapper(EditLine *el __attribute__((__unused__)), unsigned char c)
{
	if (map[c] == NULL)
		return CC_ERROR;

	_rl_update_pos();

	(*map[c])(1, c);

	/* If rl_done was set by the above call, deal with it here */
	if (rl_done)
		return CC_EOF;

	return CC_NORM;
}